

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_3U>::getSINT
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_3U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int32_t outValue_1;
  int8_t outValue;
  uint uVar9;
  allocator_type local_31;
  
  if (3 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x3f8,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  uVar3 = targetBits - 8 >> 3;
  uVar9 = targetBits << 0x1d | uVar3;
  if ((uVar9 < 8) && ((0x8bU >> (uVar3 & 0x1f) & 1) != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((targetBits >> 3) * numChannels * (this->super_Image).height *
                      (this->super_Image).width),&local_31);
    if ((this->super_Image).height != 0) {
      uVar3 = 0;
      do {
        if ((this->super_Image).width != 0) {
          uVar4 = 0;
          do {
            if (numChannels != 0) {
              uVar6 = 0;
              do {
                uVar5 = (uint)uVar6;
                uVar8 = 2;
                if (uVar5 < 2) {
                  uVar8 = uVar6;
                }
                if (uVar9 < 8) {
                  uVar7 = (this->super_Image).width * uVar3 + uVar4;
                  bVar1 = this->pixels[uVar7].field_0.comps[uVar8];
                  puVar2 = (__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar7 = (uVar7 * numChannels + uVar5) * (targetBits >> 3);
                  switch(uVar9) {
                  case 0:
                    puVar2[uVar7] = bVar1;
                    break;
                  case 1:
                    *(ushort *)(puVar2 + uVar7) = (ushort)bVar1;
                    break;
                  case 3:
                    *(uint *)(puVar2 + uVar7) = (uint)bVar1;
                    break;
                  case 7:
                    *(ulong *)(puVar2 + uVar7) = (ulong)bVar1;
                  }
                }
                uVar6 = (ulong)(uVar5 + 1);
              } while (numChannels != uVar5 + 1);
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < (this->super_Image).width);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (this->super_Image).height);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x3f9,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSINT(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : c != 3 ? 0 : componentType{1};
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<int8_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<int16_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<int32_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 8) {
                        const auto outValue = static_cast<int64_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }